

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O1

void __thiscall
Array_sub_ranges_by_index_Test::~Array_sub_ranges_by_index_Test
          (Array_sub_ranges_by_index_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Array, sub_ranges_by_index) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // check that reference range from a subrange works
    by_value v1(10);
    for(int i=0; i<10; i++)
        v1[i] = double(i);

    // create a reference wrapper to the second half of v1
    auto r1 = v1(5,end);
    EXPECT_EQ(r1.size(), 5);
    EXPECT_EQ(v1.data()+5, r1.data());

    // create a value wrapper (copy) of the reference range
    // should contain a copy of the second half of v1
    by_value v2(r1);
    EXPECT_NE(r1.data(), v2.data());
    EXPECT_EQ(r1.size(), v2.size());
    auto it1 = v1.data();
    auto it2 = v2.data();
    for(auto i=0; i<5; ++i) {
        EXPECT_EQ(it1[i+5], it2[i]);
    }
}